

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeRefEq(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Type TVar2;
  Expression *left_00;
  Expression *right_00;
  RefEq *pRVar3;
  bool local_49;
  Expression *right;
  Expression *left;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  left._4_4_ = 2;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&left + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x129c,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
  }
  bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
  local_49 = false;
  if (bVar1) {
    local_49 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178));
  }
  if (local_49 != false) {
    TVar2 = getEqReferenceType(this);
    left_00 = make(this,TVar2);
    TVar2 = getEqReferenceType(this);
    right_00 = make(this,TVar2);
    pRVar3 = Builder::makeRefEq(&this->builder,left_00,right_00);
    return (Expression *)pRVar3;
  }
  __assert_fail("wasm.features.hasReferenceTypes() && wasm.features.hasGC()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x129d,"Expression *wasm::TranslateToFuzzReader::makeRefEq(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeRefEq(Type type) {
  assert(type == Type::i32);
  assert(wasm.features.hasReferenceTypes() && wasm.features.hasGC());
  auto* left = make(getEqReferenceType());
  auto* right = make(getEqReferenceType());
  return builder.makeRefEq(left, right);
}